

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O2

_inlet * symbolinlet_new(t_object *owner,t_symbol **sp)

{
  _inlet *p_Var1;
  _inlet *p_Var2;
  _inlet *p_Var3;
  _inlet **pp_Var4;
  
  p_Var2 = (_inlet *)pd_new(symbolinlet_class);
  p_Var2->i_owner = owner;
  p_Var2->i_dest = (t_pd *)0x0;
  p_Var2->i_symfrom = &s_symbol;
  (p_Var2->i_un).iu_symslot = sp;
  p_Var2->i_next = (_inlet *)0x0;
  p_Var1 = owner->te_inlet;
  if (owner->te_inlet == (_inlet *)0x0) {
    pp_Var4 = &owner->te_inlet;
  }
  else {
    do {
      p_Var3 = p_Var1;
      p_Var1 = p_Var3->i_next;
    } while (p_Var1 != (_inlet *)0x0);
    pp_Var4 = &p_Var3->i_next;
  }
  *pp_Var4 = p_Var2;
  return p_Var2;
}

Assistant:

t_inlet *symbolinlet_new(t_object *owner, t_symbol **sp)
{
    t_inlet *x = (t_inlet *)pd_new(symbolinlet_class), *y, *y2;
    x->i_owner = owner;
    x->i_dest = 0;
    x->i_symfrom = &s_symbol;
    x->i_symslot = sp;
    x->i_next = 0;
    if ((y = owner->ob_inlet))
    {
        while ((y2 = y->i_next)) y = y2;
        y->i_next = x;
    }
    else owner->ob_inlet = x;
    return (x);
}